

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O3

void __thiscall Gecko::Subgraph::optimize(Subgraph *this,uint p)

{
  Subnode *pSVar1;
  long lVar2;
  float fVar3;
  pointer pNVar4;
  WeightedValue WVar5;
  uint uVar6;
  ulong uVar7;
  Graph *pGVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  byte bVar15;
  char cVar16;
  long lVar17;
  uint m;
  uint uVar18;
  Float (*paFVar19) [16];
  Index *pIVar20;
  Float pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> external;
  uint local_74;
  float local_70;
  int local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  ulong local_50;
  long local_48;
  Float (*local_40) [16];
  ulong local_38;
  
  pNVar4 = (this->g->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (this->g->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[p];
  local_70 = pNVar4[uVar14].pos - pNVar4[uVar14].hlen;
  (this->min).super_WeightedValue = (WeightedValue)0x3f8000007f7fffff;
  uVar14 = this->n;
  if (uVar14 == 0) {
    uVar14 = 0;
  }
  else {
    paFVar19 = this->weight;
    cVar16 = '\0';
    uVar10 = 0;
    uVar7 = 0;
    local_40 = paFVar19;
    do {
      uVar11 = uVar7 & 0xff;
      this->perm[uVar11] = (Index)uVar7;
      this->best[uVar11] = (Index)uVar7;
      pGVar8 = this->g;
      uVar9 = (pGVar8->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[(int)uVar10 + p];
      this->adj[uVar11] = 0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      pNVar4 = (pGVar8->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_74 = pNVar4[uVar9 - 1].arc;
      local_48 = (ulong)uVar9 * 0x10;
      local_50 = uVar10;
      if (local_74 < pNVar4[uVar9].arc) {
        do {
          uVar14 = this->n;
          if (uVar14 == 0) {
LAB_0010c2db:
            if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert
                        (&local_68,
                         (iterator)
                         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_74);
              pGVar8 = this->g;
            }
            else {
              *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_74;
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            uVar9 = 0;
            bVar15 = 0;
            do {
              if ((pGVar8->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar9 + p] ==
                  (pGVar8->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[local_74]) break;
              bVar15 = bVar15 + 1;
              uVar9 = (uint)bVar15;
            } while (uVar9 < uVar14);
            if (uVar14 == uVar9) goto LAB_0010c2db;
            this->adj[uVar11] = this->adj[uVar11] + (1 << ((byte)uVar9 & 0x1f));
            *(float *)((long)*paFVar19 + (ulong)bVar15 * 4 + (ulong)(uint)((int)uVar11 << 6)) =
                 (pGVar8->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[local_74];
          }
          local_74 = local_74 + 1;
        } while (local_74 <
                 *(uint *)((long)&((pGVar8->node).
                                   super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->arc + local_48));
        uVar14 = this->n;
      }
      uVar9 = 1 << ((byte)local_50 & 0x1f);
      this->node[uVar11] = this->cache + ((int)local_50 << ((byte)uVar14 & 0x1f));
      local_6c = uVar9 - 1;
      uVar18 = 0;
      uVar7 = local_50;
      local_38 = uVar11;
      do {
        if ((uVar18 & uVar9) == 0) {
          pSVar1 = this->cache + (long)((int)uVar7 << ((byte)uVar14 & 0x1f)) + (ulong)uVar18;
          pGVar8 = this->g;
          pNVar4 = (pGVar8->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pos = *(float *)((long)&pNVar4->hlen + local_48) + local_70;
          pSVar1->pos = pos;
          if (uVar14 != 0) {
            uVar12 = 0;
            uVar6 = 1;
            do {
              if (((char)(cVar16 + (char)uVar6) != '\x01') && ((uVar18 >> (uVar12 & 0x1f) & 1) == 0)
                 ) {
                fVar3 = pNVar4[(pGVar8->perm).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar12 + p]].hlen;
                pos = pos + fVar3 + fVar3;
                pSVar1->pos = pos;
              }
              uVar12 = uVar6 & 0xff;
              uVar6 = uVar12 + 1;
            } while (uVar12 < uVar14);
          }
          WVar5 = (WeightedValue)Graph::cost(pGVar8,&local_68,pos);
          (pSVar1->cost).super_WeightedValue = WVar5;
          uVar14 = this->n;
          uVar7 = local_50;
        }
        else {
          uVar18 = uVar18 + local_6c;
        }
        uVar10 = local_38;
        paFVar19 = local_40;
        uVar18 = uVar18 + 1;
        uVar6 = 1 << ((byte)uVar14 & 0x1f);
      } while (uVar18 < uVar6);
      this->node[local_38] = this->node[local_38] + (uVar6 + (-2 << ((byte)uVar7 & 0x1f)));
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        uVar14 = this->n;
      }
      uVar9 = (int)uVar10 + 1;
      uVar7 = (ulong)uVar9;
      uVar10 = (ulong)(byte)uVar9;
      cVar16 = cVar16 + -1;
    } while ((uVar9 & 0xff) < uVar14);
  }
  optimize(this,(WeightedSum)0x0,uVar14);
  if (this->n != 0) {
    pIVar20 = this->best;
    lVar17 = 1;
    uVar7 = 0;
    do {
      pIVar20 = pIVar20 + 1;
      Graph::swap(this->g,p + (int)uVar7,this->best[uVar7] + p);
      uVar10 = uVar7 + 1;
      uVar11 = (ulong)this->n;
      if (uVar11 <= uVar10) {
        return;
      }
      lVar13 = 0;
      do {
        if (uVar7 == pIVar20[lVar13]) {
          pIVar20[lVar13] = this->best[uVar7];
        }
        lVar2 = lVar17 + lVar13;
        lVar13 = lVar13 + 1;
      } while (lVar2 + 1U < uVar11);
      lVar17 = lVar17 + 1;
      uVar7 = uVar10;
    } while (uVar10 < uVar11);
  }
  return;
}

Assistant:

void
Subgraph::optimize(uint p)
{
  // Initialize subgraph.
  const Float q = g->node[g->perm[p]].pos - g->node[g->perm[p]].hlen;
  min = WeightedSum(GECKO_FLOAT_MAX, 1);
  for (Subnode::Index k = 0; k < n; k++) {
    best[k] = perm[k] = k;
    Node::Index i = g->perm[p + k];
    // Copy i's outgoing arcs.  We distinguish between internal
    // and external arcs to nodes within and outside the subgraph,
    // respectively.
#if GECKO_WITH_ADJLIST
    uint m = 0;
#else
    adj[k] = 0;
#endif
    std::vector<Arc::Index> external;
    for (Arc::Index a = g->node_begin(i); a < g->node_end(i); a++) {
      Node::Index j = g->adj[a];
      Subnode::Index l;
      for (l = 0; l < n && g->perm[p + l] != j; l++);
      if (l == n)
        external.push_back(a);
      else {
        // Copy internal arc to subgraph.
#if GECKO_WITH_ADJLIST
        adj[k][m] = l;
        weight[k][m] = g->weight[a];
        m++;
#else
        adj[k] += 1u << l;
        weight[k][l] = g->weight[a];
#endif
      }
    }
#if GECKO_WITH_ADJLIST
    adj[k][m] = k;
#endif
    // Precompute external costs associated with all possible positions
    // of this node.  Since node lengths can be arbitrary, there are as
    // many as 2^(n-1) possible positions, each corresponding to an
    // (n-1)-bit string that specifies whether the remaining n-1 nodes
    // succeed this node or not.  Caching the
    //                n
    //   2^(n-1) n = sum k C(n, k) = A001787
    //               k=1
    // external costs is exponentially cheaper than recomputing the
    //      n-1         n
    //   n! sum 1/k! = sum k! C(n, k) = A007526
    //      k=0        k=1
    // costs associated with all permutations.
    node[k] = cache + (k << n);
    for (uint m = 0; m < (1u << n); m++)
      if (!(m & (1u << k))) {
        Subnode* s = cache + (k << n) + m;
        s->pos = q + g->node[i].hlen;
        for (Subnode::Index l = 0; l < n; l++)
          if (l != k && !(m & (1u << l)))
            s->pos += 2 * g->node[g->perm[p + l]].hlen;
        s->cost = g->cost(external, s->pos);
      }
      else
        m += (1u << k) - 1;
    node[k] += (1u << n) - (2u << k);
  }

  // Find optimal permutation of the n nodes.
  optimize(0, n);

  // Apply permutation to original graph.
  for (uint i = 0; i < n; i++) {
    g->swap(p + i, p + best[i]);
    for (uint j = i + 1; j < n; j++)
      if (best[j] == i)
        best[j] = best[i];
  }
}